

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.cpp
# Opt level: O3

void freearg(arg_t *a)

{
  arg_t *paVar1;
  arg_t *p;
  
  if (a != (arg_t *)0x0) {
    do {
      freeattr(a->arg);
      paVar1 = a->next;
      free(a);
      a = paVar1;
    } while (paVar1 != (arg_t *)0x0);
  }
  return;
}

Assistant:

static void freearg(struct arg_t *a) {
    struct arg_t *p = a;
    while (p) {
        freeattr(p->arg);
        a = p;
        p = p->next;
        free(a);
    }
}